

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O3

void __thiscall pm::Sampler::Sampler(Sampler *this,Type type,uint numSamples)

{
  this->_vptr_Sampler = (_func_int **)&PTR__Sampler_00114ab0;
  this->type_ = type;
  this->numSamples_ = numSamples;
  this->numSets_ = 0x53;
  (this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->diskSamples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->diskSamples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->diskSamples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hemisphereSamples_).super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hemisphereSamples_).super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hemisphereSamples_).super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shuffledIndices_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shuffledIndices_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shuffledIndices_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Random::Random(&this->rnd_);
  std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::reserve
            (&this->samples_,(ulong)(this->numSets_ * this->numSamples_));
  setupShuffleIndices(this);
  return;
}

Assistant:

Sampler::Sampler(Type type, unsigned int numSamples)
    : type_(type), numSamples_(numSamples), numSets_(83)
{
	samples_.reserve(numSamples_ * numSets_);
	setupShuffleIndices();
}